

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

int __thiscall
cppqc::Generator<std::tuple<Rectangle>_>::GenModel<cppqc::detail::TupleGenerator<Rectangle>_>::clone
          (GenModel<cppqc::detail::TupleGenerator<Rectangle>_> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  void *pvVar1;
  TupleGenerator<Rectangle> *in_stack_ffffffffffffffc8;
  TupleGenerator<Rectangle> *in_stack_ffffffffffffffe8;
  GenModel<cppqc::detail::TupleGenerator<Rectangle>_> *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x10);
  detail::TupleGenerator<Rectangle>::TupleGenerator
            ((TupleGenerator<Rectangle> *)this,in_stack_ffffffffffffffc8);
  GenModel(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  detail::TupleGenerator<Rectangle>::~TupleGenerator((TupleGenerator<Rectangle> *)0x11744c);
  return (int)pvVar1;
}

Assistant:

detail::GenConcept<T>* clone() const override {
      return new GenModel(m_obj);
    }